

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O1

int __thiscall
CVmObjDict::getp_for_each_word(CVmObjDict *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  for_each_word_enum_cb_ctx ctx;
  vm_val_t *local_80;
  undefined8 local_78;
  vm_rcdesc local_70;
  
  if (getp_for_each_word(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_for_each_word();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_for_each_word::desc);
  pvVar2 = sp_;
  if (iVar3 == 0) {
    local_80 = sp_ + -1;
    pvVar1 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar1 = VM_OBJ;
    (pvVar2->val).obj = self;
    local_78 = 0;
    vm_rcdesc::init(&local_70,(EVP_PKEY_CTX *)"Dict.forEachWord");
    CVmHashTable::safe_enum_entries
              (*(CVmHashTable **)((this->super_CVmObject).ext_ + 0x10),for_each_word_enum_cb,
               &local_80);
    sp_ = sp_ + -2;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_for_each_word(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                   uint *argc)
{
    static CVmNativeCodeDesc desc(1);
    vm_val_t *cb_val;
    int orig_argc = (argc != 0 ? *argc : 0);
    for_each_word_enum_cb_ctx ctx;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get a pointer to the callback value, but leave it on the stack */
    cb_val = G_stk->get(0);

    /* push a self-reference for gc protection while we're working */
    G_stk->push()->set_obj(self);

    /* 
     *   enumerate the entries in our underlying hashtable - use the "safe"
     *   enumerator to ensure that we're insulated from any changes to the
     *   hashtable that the callback wants to make 
     */
    ctx.vmg = VMGLOB_ADDR;
    ctx.cb_val = cb_val;
    ctx.rc.init(vmg_ "Dict.forEachWord", self, 6, cb_val, orig_argc);
    get_ext()->hashtab_->safe_enum_entries(for_each_word_enum_cb, &ctx);

    /* discard arguments and gc protection */
    G_stk->discard(2);

    /* there's no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}